

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O1

void __thiscall
btAlignedObjectArray<btPersistentManifold_*>::quickSortInternal<btPersistentManifoldSortPredicate>
          (btAlignedObjectArray<btPersistentManifold_*> *this,
          btPersistentManifoldSortPredicate *CompareFunc,int lo,int hi)

{
  int iVar1;
  btPersistentManifold *pbVar2;
  btPersistentManifold **ppbVar3;
  btPersistentManifold *pbVar4;
  btPersistentManifold *pbVar5;
  int iVar6;
  int hi_00;
  int iVar7;
  int iVar8;
  long lVar9;
  btPersistentManifold *temp;
  int iVar10;
  long lVar11;
  
  do {
    pbVar2 = this->m_data[(hi + lo) / 2];
    iVar7 = lo;
    hi_00 = hi;
    do {
      ppbVar3 = this->m_data;
      iVar1 = pbVar2->m_body0->m_islandTag1;
      lVar9 = (long)iVar7 + -1;
      iVar6 = iVar7;
      do {
        iVar7 = iVar6;
        pbVar4 = ppbVar3[lVar9 + 1];
        iVar10 = pbVar4->m_body0->m_islandTag1;
        if (iVar10 < 0) {
          iVar10 = pbVar4->m_body1->m_islandTag1;
        }
        iVar8 = iVar1;
        if (iVar1 < 0) {
          iVar8 = pbVar2->m_body1->m_islandTag1;
        }
        lVar9 = lVar9 + 1;
        iVar6 = iVar7 + 1;
      } while (iVar10 < iVar8);
      lVar11 = (long)hi_00 + 1;
      iVar6 = hi_00;
      do {
        hi_00 = iVar6;
        iVar10 = iVar1;
        if (iVar1 < 0) {
          iVar10 = pbVar2->m_body1->m_islandTag1;
        }
        pbVar5 = ppbVar3[lVar11 + -1];
        iVar8 = pbVar5->m_body0->m_islandTag1;
        if (iVar8 < 0) {
          iVar8 = pbVar5->m_body1->m_islandTag1;
        }
        lVar11 = lVar11 + -1;
        iVar6 = hi_00 + -1;
      } while (iVar10 < iVar8);
      if (lVar9 <= lVar11) {
        ppbVar3[lVar9] = pbVar5;
        this->m_data[lVar11] = pbVar4;
        iVar7 = iVar7 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar7 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<btPersistentManifoldSortPredicate>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar7;
  } while (iVar7 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc,int lo, int hi)
		{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
			int i=lo, j=hi;
			T x=m_data[(lo+hi)/2];

			//  partition
			do
			{    
				while (CompareFunc(m_data[i],x)) 
					i++; 
				while (CompareFunc(x,m_data[j])) 
					j--;
				if (i<=j)
				{
					swap(i,j);
					i++; j--;
				}
			} while (i<=j);

			//  recursion
			if (lo<j) 
				quickSortInternal( CompareFunc, lo, j);
			if (i<hi) 
				quickSortInternal( CompareFunc, i, hi);
		}